

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O3

void __thiscall sc_dt::scfx_rep::scfx_rep(scfx_rep *this,int a)

{
  int iVar1;
  word *pwVar2;
  long lVar3;
  
  (this->m_mant).m_array = (word *)0x0;
  (this->m_mant).m_size = 4;
  pwVar2 = scfx_mant::alloc_word(4);
  (this->m_mant).m_array = pwVar2;
  this->m_wp = 0;
  this->m_sign = 0;
  this->m_state = normal;
  this->m_msw = 0;
  *(undefined8 *)((long)&this->m_msw + 1) = 0;
  iVar1 = (this->m_mant).m_size;
  if (a == 0) {
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        pwVar2[lVar3] = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 < (this->m_mant).m_size);
    }
    this->m_lsw = 0;
    this->m_wp = 0;
    this->m_sign = 1;
    this->m_state = normal;
    this->m_msw = 0;
  }
  else {
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        pwVar2[lVar3] = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 < (this->m_mant).m_size);
    }
    this->m_lsw = 2;
    this->m_wp = 2;
    this->m_state = normal;
    this->m_msw = 2;
    if (a < 1) {
      pwVar2[2] = -a;
      this->m_sign = -1;
    }
    else {
      pwVar2[2] = a;
      this->m_sign = 1;
    }
  }
  return;
}

Assistant:

scfx_rep::scfx_rep( int a )
: m_mant( min_mant ), m_wp(), m_sign(), m_state(), m_msw(), m_lsw(),
  m_r_flag( false )
{
    if( a != 0 )
    {
        m_mant.clear();
	m_wp = m_msw = m_lsw = 2;
	m_state = normal;
	if( a > 0 )
	{
	    m_mant[2] = a;
	    m_sign = 1;
	}
	else
	{
	    m_mant[2] = -a;
	    m_sign = -1;
	}
    }
    else
        set_zero();
}